

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::waitForBytesWritten(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  bool bVar1;
  int iVar2;
  QRingBuffer *pQVar3;
  long in_FS_OFFSET;
  QString local_68;
  pollfd local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
  if (pQVar3 != (QRingBuffer *)0x0) {
    while (pQVar3->bufferSize != 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_14cf1db::QProcessPoller::QProcessPoller((QProcessPoller *)&local_48,this);
      iVar2 = qt_safe_poll(&local_48,4,*deadline);
      if (iVar2 < 0) break;
      if (iVar2 == 0) {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
        setError(this,Timedout,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        break;
      }
      if ((-1 < local_48.fd) && (((ulong)local_48 & 0x3c000000000000) != 0)) {
        bVar1 = _q_canWrite(this);
        goto LAB_0042533d;
      }
      if ((-1 < (int)puStack_40) && (((ulong)puStack_40 & 0x39000000000000) != 0)) {
        _q_canReadStandardOutput(this);
      }
      if ((-1 < (int)local_38) && (((ulong)local_38 & 0x39000000000000) != 0)) {
        _q_canReadStandardError(this);
      }
      if (this->processState == '\0') break;
      if ((-1 < (int)puStack_30) && (((ulong)puStack_30 & 0x39000000000000) != 0)) {
        processFinished(this);
        break;
      }
      pQVar3 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
      if (pQVar3 == (QRingBuffer *)0x0) break;
    }
  }
  bVar1 = false;
LAB_0042533d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QProcessPrivate::waitForBytesWritten(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForBytesWritten(%lld)", deadline.remainingTime());
#endif

    while (!writeBuffer.isEmpty()) {
        QProcessPoller poller(*this);

        int ret = poller.poll(deadline);

        if (ret < 0) {
            break;
        }

        if (ret == 0) {
            setError(QProcess::Timedout);
            return false;
        }

        if (qt_pollfd_check(poller.stdinPipe(), POLLOUT))
            return _q_canWrite();

        if (qt_pollfd_check(poller.stdoutPipe(), POLLIN))
            _q_canReadStandardOutput();

        if (qt_pollfd_check(poller.stderrPipe(), POLLIN))
            _q_canReadStandardError();

        // Signals triggered by I/O may have stopped this process:
        if (processState == QProcess::NotRunning)
            return false;

        if (qt_pollfd_check(poller.forkfd(), POLLIN)) {
            processFinished();
            return false;
        }
    }

    return false;
}